

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O2

FStateLabel *
BinarySearch<FStateLabel,FName>
          (FStateLabel *first,int max,offset_in_FStateLabel_to_unknown keyptr,FName *key)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = max + -1;
  iVar4 = 0;
  while( true ) {
    if (iVar2 < iVar4) {
      return (FStateLabel *)0x0;
    }
    uVar3 = (uint)(iVar2 + iVar4) >> 1;
    iVar1 = *(int *)((long)&first[uVar3].Label.Index + keyptr);
    if (iVar1 == key->Index) break;
    if (iVar1 < key->Index) {
      iVar4 = uVar3 + 1;
    }
    else {
      iVar2 = uVar3 - 1;
    }
  }
  return first + uVar3;
}

Assistant:

inline
const ClassType *BinarySearch (const ClassType *first, int max,
	const KeyType ClassType::*keyptr, const KeyType key)
{
	int min = 0;
	--max;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		const ClassType *probe = &first[mid];
		const KeyType &seekey = probe->*keyptr;
		if (seekey == key)
		{
			return probe;
		}
		else if (seekey < key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}